

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void glfwGetVersion(int *major,int *minor,int *rev)

{
  int *rev_local;
  int *minor_local;
  int *major_local;
  
  if (major != (int *)0x0) {
    *major = 3;
  }
  if (minor != (int *)0x0) {
    *minor = 2;
  }
  if (rev != (int *)0x0) {
    *rev = 1;
  }
  return;
}

Assistant:

GLFWAPI void glfwGetVersion(int* major, int* minor, int* rev)
{
    if (major != NULL)
        *major = GLFW_VERSION_MAJOR;

    if (minor != NULL)
        *minor = GLFW_VERSION_MINOR;

    if (rev != NULL)
        *rev = GLFW_VERSION_REVISION;
}